

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qfbscreen_p.cpp
# Opt level: O0

void QFbScreen::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QFbScreen *in_RCX;
  int in_EDX;
  int in_ESI;
  QSize *in_RDI;
  QRect *unaff_retaddr;
  QFbScreen *_t;
  
  if (in_ESI == 0) {
    if (in_EDX == 0) {
      (**(code **)((long)*in_RDI + 0xd0))(in_RDI,*(undefined8 *)&in_RCX->field_0x8);
    }
    else if (in_EDX == 1) {
      setPhysicalSize(in_RCX,in_RDI);
    }
    else if (in_EDX == 2) {
      setGeometry(_t,unaff_retaddr);
    }
  }
  return;
}

Assistant:

void QFbScreen::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QFbScreen *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->setDirty((*reinterpret_cast< std::add_pointer_t<QRect>>(_a[1]))); break;
        case 1: _t->setPhysicalSize((*reinterpret_cast< std::add_pointer_t<QSize>>(_a[1]))); break;
        case 2: _t->setGeometry((*reinterpret_cast< std::add_pointer_t<QRect>>(_a[1]))); break;
        default: ;
        }
    }
}